

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void __thiscall ncnn::UnlockedPoolAllocator::UnlockedPoolAllocator(UnlockedPoolAllocator *this)

{
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__UnlockedPoolAllocator_00161670;
  (this->budgets).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->budgets;
  (this->budgets).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->budgets;
  (this->budgets).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->payouts).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->payouts;
  (this->payouts).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->payouts;
  (this->payouts).
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  ._M_impl._M_node._M_size = 0;
  this->size_compare_ratio = 0xc0;
  return;
}

Assistant:

UnlockedPoolAllocator::UnlockedPoolAllocator()
{
    size_compare_ratio = 192;// 0.75f * 256
}